

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hq4x_16.cpp
# Opt level: O3

bool Diff(uint rgb1,uint rgb2)

{
  undefined8 in_MM0;
  undefined8 uVar1;
  undefined8 in_MM1;
  ulong uVar2;
  ulong uVar3;
  undefined1 in_XMM1 [16];
  
  if (rgb1 == rgb2) {
    return false;
  }
  if (Diff(unsigned_int,unsigned_int)::THRESHOLD == '\0') {
    Diff();
  }
  uVar1 = movdq2q(in_MM0,ZEXT416((uint)RGBtoYUV[rgb1]));
  uVar1 = movdq2q(uVar1,in_XMM1);
  uVar3 = psubusb(uVar1,in_MM1);
  uVar2 = psubusb(in_MM1,uVar1);
  uVar1 = psubusb(uVar2 | uVar3,Diff::THRESHOLD.m_value[0]);
  return (int)uVar1 != 0;
}

Assistant:

bool Diff(const unsigned int rgb1, const unsigned int rgb2)
{
  if (rgb1 == rgb2)
  {
    return false;
  }
	
  static const hq_vec THRESHOLD = 0x00300706;
  
  const hq_vec yuv1 = RGBtoYUV[rgb1];
  const hq_vec yuv2 = RGBtoYUV[rgb2];

  const hq_vec delta1 = yuv1 - yuv2;
  const hq_vec delta2 = yuv2 - yuv1;

  const hq_vec delta  = delta1 | delta2;
  const hq_vec result = delta - THRESHOLD;

  return 0 != result;
}